

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

ch_string * ch_concatstring(ch_context *vm,ch_string *left,ch_string *right)

{
  ulong size_00;
  char *value_00;
  ch_string *pcVar1;
  char *value;
  size_t size;
  ch_string *right_local;
  ch_string *left_local;
  ch_context *vm_local;
  
  size_00 = (ulong)(left->size + right->size);
  value_00 = (char *)malloc(size_00 + 1);
  memcpy(value_00,left->value,(ulong)left->size);
  memcpy(value_00 + left->size,right->value,(ulong)right->size);
  value_00[size_00] = '\0';
  pcVar1 = register_allocated_string(vm,value_00,size_00);
  return pcVar1;
}

Assistant:

ch_string *ch_concatstring(ch_context *vm, ch_string* left, ch_string* right) {
  size_t size = left->size + right->size;
  char *value = (char*) malloc(size + 1);
  memcpy(value, left->value, left->size);
  memcpy(value + left->size, right->value, right->size);
  value[size] = '\0';

  return register_allocated_string(vm, value, size);
}